

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O3

CURLcode Curl_doh_is_resolved(connectdata *conn,Curl_dns_entry **dnsp)

{
  ushort uVar1;
  int iVar2;
  Curl_easy *data;
  Curl_easy *data_00;
  undefined8 uVar3;
  DOHcode DVar4;
  DOHcode DVar5;
  size_t sVar6;
  Curl_addrinfo *pCVar7;
  sockaddr *psVar8;
  Curl_dns_entry *pCVar9;
  sa_family_t sVar10;
  char *pcVar11;
  undefined8 *puVar12;
  uchar *puVar13;
  size_t maxlength;
  Curl_addrinfo *cahead;
  curl_socklen_t cVar14;
  char *pcVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  Curl_addrinfo *pCVar20;
  dohentry de;
  dohentry local_308;
  char local_b8 [10];
  char local_ae [126];
  
  data = conn->data;
  *dnsp = (Curl_dns_entry *)0x0;
  data_00 = (data->req).doh.probe[0].easy;
  if ((data_00 == (Curl_easy *)0x0) && ((data->req).doh.probe[1].easy == (CURL_conflict *)0x0)) {
    Curl_failf(data,"Could not DOH-resolve: %s",(conn->async).hostname);
    return (((conn->bits).field_0x4 & 0x10) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if ((data->req).doh.pending != 0) {
    return CURLE_OK;
  }
  curl_multi_remove_handle(data->multi,data_00);
  Curl_close((data->req).doh.probe[0].easy);
  curl_multi_remove_handle(data->multi,(data->req).doh.probe[1].easy);
  Curl_close((data->req).doh.probe[1].easy);
  memset(&local_308,0,0x250);
  local_308.ttl = 0x7fffffff;
  DVar4 = doh_decode((data->req).doh.probe[0].serverdoh.memory,
                     (data->req).doh.probe[0].serverdoh.size,(data->req).doh.probe[0].dnstype,
                     &local_308);
  (*Curl_cfree)((data->req).doh.probe[0].serverdoh.memory);
  if (DVar4 != DOH_OK) {
    if (DVar4 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
      pcVar15 = errors[DVar4];
    }
    else {
      pcVar15 = "bad error code";
    }
    pcVar11 = "AAAA";
    if ((data->req).doh.probe[0].dnstype == 1) {
      pcVar11 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s\n",pcVar15,pcVar11,(data->req).doh.host);
  }
  DVar5 = doh_decode((data->req).doh.probe[1].serverdoh.memory,
                     (data->req).doh.probe[1].serverdoh.size,(data->req).doh.probe[1].dnstype,
                     &local_308);
  (*Curl_cfree)((data->req).doh.probe[1].serverdoh.memory);
  if (DVar5 != DOH_OK) {
    if (DVar5 < (DOH_DNS_BAD_ID|DOH_DNS_BAD_LABEL)) {
      pcVar15 = errors[DVar5];
    }
    else {
      pcVar15 = "bad error code";
    }
    pcVar11 = "AAAA";
    if ((data->req).doh.probe[1].dnstype == 1) {
      pcVar11 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s\n",pcVar15,pcVar11,(data->req).doh.host);
    if (DVar4 != DOH_OK) goto LAB_004f1bab;
  }
  Curl_infof(data,"DOH Host name: %s\n",(data->req).doh.host);
  Curl_infof(data,"TTL: %u seconds\n",(ulong)local_308.ttl);
  lVar17 = (long)local_308.numaddr;
  if (0 < lVar17) {
    puVar13 = local_308.addr[0].ip.v4 + 1;
    lVar16 = 0;
    do {
      iVar2 = local_308.addr[lVar16].type;
      if (iVar2 == 0x1c) {
        curl_msnprintf(local_b8,0x80,"DOH AAAA: ");
        maxlength = 0x76;
        uVar18 = 0xfffffffffffffffe;
        pcVar15 = local_ae;
        do {
          pcVar11 = "    :";
          if (uVar18 == 0xfffffffffffffffe) {
            pcVar11 = "PK\x01\x02";
          }
          curl_msnprintf(pcVar15,maxlength,"%s%02x%02x",pcVar11 + 4,(ulong)puVar13[uVar18 + 1],
                         (ulong)puVar13[uVar18 + 2]);
          sVar6 = strlen(pcVar15);
          maxlength = maxlength - sVar6;
          pcVar15 = pcVar15 + sVar6;
          uVar18 = uVar18 + 2;
        } while (uVar18 < 0xe);
        Curl_infof(data,"%s\n",local_b8);
      }
      else if (iVar2 == 1) {
        Curl_infof(data,"DOH A: %u.%u.%u.%u\n",(ulong)local_308.addr[lVar16].ip.v4[0],
                   (ulong)local_308.addr[lVar16].ip.v4[1],(ulong)local_308.addr[lVar16].ip.v4[2],
                   (ulong)local_308.addr[lVar16].ip.v4[3]);
      }
      lVar16 = lVar16 + 1;
      puVar13 = puVar13 + 0x14;
    } while (lVar16 != lVar17);
  }
  lVar16 = (long)local_308.numcname;
  if (0 < lVar16) {
    lVar19 = 0;
    do {
      Curl_infof(data,"CNAME: %s\n",*(undefined8 *)((long)&local_308.cname[0].alloc + lVar19));
      lVar19 = lVar19 + 0x18;
    } while (lVar16 * 0x18 != lVar19);
  }
  if (local_308.numaddr < 1) {
LAB_004f1f96:
    if (local_308.numcname < 1) {
      return CURLE_OUT_OF_MEMORY;
    }
    lVar17 = 0;
    do {
      (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar17));
      lVar17 = lVar17 + 0x18;
    } while (lVar16 * 0x18 != lVar17);
    return CURLE_OUT_OF_MEMORY;
  }
  pcVar15 = (data->req).doh.host;
  uVar1 = (ushort)(data->req).doh.port;
  lVar19 = 0;
  cahead = (Curl_addrinfo *)0x0;
  pCVar20 = (Curl_addrinfo *)0x0;
  do {
    iVar2 = *(int *)((long)&local_308.addr[0].type + lVar19);
    cVar14 = 0x1c;
    if (iVar2 != 0x1c) {
      cVar14 = 0x10;
    }
    pCVar7 = (Curl_addrinfo *)(*Curl_ccalloc)(1,0x30);
    if (pCVar7 == (Curl_addrinfo *)0x0) {
LAB_004f1f89:
      Curl_freeaddrinfo(cahead);
      goto LAB_004f1f96;
    }
    pcVar11 = (*Curl_cstrdup)(pcVar15);
    pCVar7->ai_canonname = pcVar11;
    if (pcVar11 == (char *)0x0) {
LAB_004f1f7d:
      (*Curl_cfree)(pCVar7);
      goto LAB_004f1f89;
    }
    psVar8 = (sockaddr *)(*Curl_ccalloc)(1,(size_t)cVar14);
    pCVar7->ai_addr = psVar8;
    if (psVar8 == (sockaddr *)0x0) {
      (*Curl_cfree)(pCVar7->ai_canonname);
      goto LAB_004f1f7d;
    }
    if (cahead == (Curl_addrinfo *)0x0) {
      cahead = pCVar7;
    }
    if (pCVar20 != (Curl_addrinfo *)0x0) {
      pCVar20->ai_next = pCVar7;
    }
    puVar12 = (undefined8 *)((long)&local_308.addr[0].ip + lVar19);
    pCVar7->ai_family = (uint)(iVar2 == 0x1c) * 8 + 2;
    pCVar7->ai_socktype = 1;
    pCVar7->ai_addrlen = cVar14;
    if (iVar2 == 0x1c) {
      uVar3 = *(undefined8 *)((long)&local_308.addr[0].ip + lVar19 + 8);
      *(undefined8 *)(psVar8->sa_data + 6) = *puVar12;
      psVar8[1].sa_family = (short)uVar3;
      psVar8[1].sa_data[0] = (char)((ulong)uVar3 >> 0x10);
      psVar8[1].sa_data[1] = (char)((ulong)uVar3 >> 0x18);
      psVar8[1].sa_data[2] = (char)((ulong)uVar3 >> 0x20);
      psVar8[1].sa_data[3] = (char)((ulong)uVar3 >> 0x28);
      psVar8[1].sa_data[4] = (char)((ulong)uVar3 >> 0x30);
      psVar8[1].sa_data[5] = (char)((ulong)uVar3 >> 0x38);
      sVar10 = 10;
    }
    else {
      *(undefined4 *)(psVar8->sa_data + 2) = *(undefined4 *)puVar12;
      sVar10 = 2;
    }
    psVar8->sa_family = sVar10;
    *(ushort *)psVar8->sa_data = uVar1 << 8 | uVar1 >> 8;
    lVar19 = lVar19 + 0x14;
    pCVar20 = pCVar7;
  } while (lVar17 * 0x14 != lVar19);
  if (data->share != (Curl_share *)0x0) {
    Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar9 = Curl_cache_addr(data,cahead,(data->req).doh.host,(data->req).doh.port);
  if (data->share != (Curl_share *)0x0) {
    Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
  }
  if (0 < local_308.numcname) {
    lVar17 = 0;
    do {
      (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar17));
      lVar17 = lVar17 + 0x18;
    } while (lVar16 * 0x18 != lVar17);
  }
  if (pCVar9 != (Curl_dns_entry *)0x0) {
    (conn->async).dns = pCVar9;
    *dnsp = pCVar9;
    return CURLE_OK;
  }
  Curl_freeaddrinfo(cahead);
LAB_004f1bab:
  if (0 < local_308.numcname) {
    lVar17 = 0;
    do {
      (*Curl_cfree)(*(void **)((long)&local_308.cname[0].alloc + lVar17));
      lVar17 = lVar17 + 0x18;
    } while ((ulong)(uint)local_308.numcname * 0x18 != lVar17);
  }
  return CURLE_COULDNT_RESOLVE_HOST;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct connectdata *conn,
                              struct Curl_dns_entry **dnsp)
{
  struct Curl_easy *data = conn->data;
  *dnsp = NULL; /* defaults to no response */

  if(!data->req.doh.probe[0].easy && !data->req.doh.probe[1].easy) {
    failf(data, "Could not DOH-resolve: %s", conn->async.hostname);
    return conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!data->req.doh.pending) {
    DOHcode rc;
    DOHcode rc2;
    struct dohentry de;
    /* remove DOH handles from multi handle and close them */
    curl_multi_remove_handle(data->multi, data->req.doh.probe[0].easy);
    Curl_close(data->req.doh.probe[0].easy);
    curl_multi_remove_handle(data->multi, data->req.doh.probe[1].easy);
    Curl_close(data->req.doh.probe[1].easy);

    /* parse the responses, create the struct and return it! */
    init_dohentry(&de);
    rc = doh_decode(data->req.doh.probe[0].serverdoh.memory,
                    data->req.doh.probe[0].serverdoh.size,
                    data->req.doh.probe[0].dnstype,
                    &de);
    free(data->req.doh.probe[0].serverdoh.memory);
    if(rc) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc),
            type2name(data->req.doh.probe[0].dnstype),
            data->req.doh.host);
    }
    rc2 = doh_decode(data->req.doh.probe[1].serverdoh.memory,
                     data->req.doh.probe[1].serverdoh.size,
                     data->req.doh.probe[1].dnstype,
                     &de);
    free(data->req.doh.probe[1].serverdoh.memory);
    if(rc2) {
      infof(data, "DOH: %s type %s for %s\n", doh_strerror(rc2),
            type2name(data->req.doh.probe[1].dnstype),
            data->req.doh.host);
    }
    if(!rc || !rc2) {
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s\n", data->req.doh.host);
      showdoh(data, &de);

      ai = doh2ai(&de, data->req.doh.host, data->req.doh.port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, data->req.doh.host, data->req.doh.port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      de_cleanup(&de);
      if(!dns)
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      else {
        conn->async.dns = dns;
        *dnsp = dns;
        return CURLE_OK;
      }
    }
    de_cleanup(&de);

    return CURLE_COULDNT_RESOLVE_HOST;
  }

  return CURLE_OK;
}